

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeleportLib.cpp
# Opt level: O1

int TeleportFeed(int stream,float *samples,int numsamples)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  
  if (Teleport::GetSharedMemory()::shared == '\0') {
    iVar1 = __cxa_guard_acquire();
    if (iVar1 != 0) {
      Teleport::SharedMemoryHandle::SharedMemoryHandle
                ((SharedMemoryHandle *)&Teleport::GetSharedMemory()::shared);
      __cxa_atexit(Teleport::SharedMemoryHandle::~SharedMemoryHandle,
                   &Teleport::GetSharedMemory()::shared,&__dso_handle);
      __cxa_guard_release();
    }
  }
  lVar2 = (long)stream * 0x56248 + Teleport::GetSharedMemory()::shared;
  if (0 < numsamples) {
    iVar1 = *(int *)(lVar2 + 0x24);
    uVar3 = 0;
    do {
      bVar4 = iVar1 == 0x15887;
      iVar1 = iVar1 + 1;
      if (bVar4) {
        iVar1 = 0;
      }
      *(float *)(lVar2 + 0x28 + (long)iVar1 * 4) = samples[uVar3];
      uVar3 = uVar3 + 1;
    } while ((uint)numsamples != uVar3);
    *(int *)(lVar2 + 0x24) = iVar1;
  }
  return *(int *)(lVar2 + 0x24);
}

Assistant:

UNITY_AUDIODSP_EXPORT_API int TeleportFeed(int stream, float* samples, int numsamples)
{
    Teleport::Stream& s = Teleport::GetSharedMemory()->streams[stream];
    for (int n = 0; n < numsamples; n++)
        s.Feed(samples[n]);
    return s.writepos;
}